

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tandem.hpp
# Opt level: O3

void tandem::detail::add_maximal_periodicities<std::__cxx11::string>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str,
               LZBlock *prev_block,LZBlock *block,uint32_t min_period,uint32_t max_period,
               LMRVector *result)

{
  pointer pcVar1;
  uint uVar2;
  uint uVar3;
  pointer pcVar4;
  int iVar5;
  pointer pcVar6;
  pointer pcVar7;
  ulong uVar8;
  pointer pcVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  uint local_6c;
  uint local_68;
  uint local_64;
  long local_60;
  ulong local_58;
  ulong local_50;
  uint local_44;
  deque<tandem::Repeat,std::allocator<tandem::Repeat>> *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  uVar2 = block->pos;
  uVar14 = (ulong)uVar2;
  uVar3 = block->length;
  local_44 = uVar3 + prev_block->length * 2;
  if (uVar2 <= local_44) {
    local_44 = uVar2;
  }
  local_60 = CONCAT44(local_60._4_4_,max_period);
  if (uVar3 < max_period) {
    max_period = uVar3;
  }
  uVar8 = (ulong)(uVar2 - local_44);
  local_50 = (ulong)(uVar3 + uVar2);
  local_40 = (deque<tandem::Repeat,std::allocator<tandem::Repeat>> *)result;
  local_38 = str;
  if (min_period <= max_period) {
    local_58 = (ulong)(uVar2 - 1);
    uVar15 = ~local_58;
    local_6c = min_period;
    do {
      uVar10 = local_6c + uVar2;
      pcVar4 = (local_38->_M_dataplus)._M_p;
      pcVar6 = pcVar4 + local_58 + 1;
      pcVar7 = pcVar6;
      if (pcVar6 != pcVar4 + uVar8) {
        lVar13 = 0;
        do {
          if (pcVar4[lVar13 + local_58] != pcVar4[lVar13 + (ulong)(uVar10 - 1)]) {
            pcVar7 = pcVar6 + lVar13;
            break;
          }
          lVar13 = lVar13 + -1;
          pcVar7 = pcVar4 + uVar8;
        } while (uVar15 + uVar8 != lVar13);
      }
      pcVar1 = pcVar4 + uVar10;
      pcVar9 = pcVar1;
      if (local_6c != uVar3) {
        pcVar9 = pcVar4 + local_50;
        lVar13 = 0;
        do {
          if (pcVar1[lVar13] != pcVar4[lVar13 + uVar14]) {
            pcVar9 = pcVar1 + lVar13;
            break;
          }
          lVar13 = lVar13 + 1;
        } while (local_50 - uVar10 != lVar13);
      }
      iVar5 = (int)pcVar6 - (int)pcVar7;
      iVar11 = (int)pcVar9 - (int)pcVar1;
      if ((local_6c <= (uint)(iVar11 + iVar5)) && (local_68 = iVar11 + local_6c, local_68 < uVar3))
      {
        local_64 = uVar2 - iVar5;
        local_68 = local_68 + iVar5;
        std::deque<tandem::Repeat,std::allocator<tandem::Repeat>>::
        emplace_back<unsigned_int,unsigned_int,unsigned_int&>
                  (local_40,&local_64,&local_68,&local_6c);
      }
      local_6c = local_6c + 1;
    } while (local_6c <= max_period);
  }
  uVar10 = (uint)local_60;
  if (local_44 < (uint)local_60) {
    uVar10 = local_44;
  }
  if (min_period < uVar10) {
    local_58 = (ulong)(uVar2 - 1);
    local_60 = uVar8 - 1;
    lVar13 = local_50 - uVar14;
    local_6c = min_period;
    do {
      uVar15 = (ulong)(~local_6c + uVar2);
      pcVar4 = (local_38->_M_dataplus)._M_p;
      pcVar6 = pcVar4 + uVar15 + 1;
      pcVar7 = pcVar6;
      if (pcVar6 != pcVar4 + uVar8) {
        lVar12 = 0;
        do {
          if (pcVar4[lVar12 + uVar15] != pcVar4[lVar12 + local_58]) {
            pcVar7 = pcVar6 + lVar12;
            break;
          }
          lVar12 = lVar12 + -1;
          pcVar7 = pcVar4 + uVar8;
        } while (local_60 - uVar15 != lVar12);
      }
      pcVar1 = pcVar4 + uVar14;
      pcVar9 = pcVar1;
      if (uVar3 != 0) {
        pcVar9 = pcVar4 + local_50;
        lVar12 = 0;
        do {
          if (pcVar1[lVar12] != pcVar4[lVar12 + (ulong)(uVar2 - local_6c)]) {
            pcVar9 = pcVar1 + lVar12;
            break;
          }
          lVar12 = lVar12 + 1;
        } while (lVar13 != lVar12);
      }
      iVar5 = (int)pcVar6 - (int)pcVar7;
      iVar11 = (int)pcVar9 - (int)pcVar1;
      if (local_6c <= (uint)(iVar11 + iVar5)) {
        iVar5 = local_6c + iVar5;
        local_64 = uVar2 - iVar5;
        local_68 = iVar5 + iVar11;
        std::deque<tandem::Repeat,std::allocator<tandem::Repeat>>::
        emplace_back<unsigned_int,unsigned_int,unsigned_int&>
                  (local_40,&local_64,&local_68,&local_6c);
      }
      local_6c = local_6c + 1;
    } while (local_6c < uVar10);
  }
  return;
}

Assistant:

void add_maximal_periodicities(const T& str, const LZBlock& prev_block, const LZBlock& block,
                               const std::uint32_t min_period, const std::uint32_t max_period,
                               LMRVector& result)
{
    const auto u   = block.pos;
    const auto n   = block.length;
    const auto m   = std::min(u, 2 * prev_block.length + n);
    const auto t   = u - m;
    const auto end = u + n;
    // rightmax periodicities
    for (auto j = min_period; j <= std::min(n, max_period); ++j) {
        const auto ls = backward_lce(str, u - 1, u + j - 1, t);
        const auto lp = forward_lce(str, u + j, u, end);
        if (ls + lp >= j && j + lp < n) {
            result.emplace_back(u - ls, j + lp + ls, j);
        }
    }
    // leftmax periodicities
    for (auto j = min_period; j < std::min(m, max_period); ++j) {
        const auto ls = backward_lce(str, u - j - 1, u - 1, t);
        const auto lp = forward_lce(str, u, u - j, end);
        if (ls + lp >= j) {
            result.emplace_back(u - (ls + j), j + lp + ls, j);
        }
    }
}